

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O2

void __thiscall
FIX::Initiator::Initiator
          (Initiator *this,Application *application,MessageStoreFactory *messageStoreFactory,
          SessionSettings *settings)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Initiator = (_func_int **)&PTR__Initiator_001ef458;
  p_Var1 = &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_pending)._M_t._M_impl.super__Rb_tree_header;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_connected)._M_t._M_impl.super__Rb_tree_header;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_disconnected)._M_t._M_impl.super__Rb_tree_header;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_sessionState)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_threadid = 0;
  this->m_application = application;
  this->m_messageStoreFactory = messageStoreFactory;
  SessionSettings::SessionSettings(&this->m_settings,settings);
  this->m_pLogFactory = (LogFactory *)0x0;
  this->m_pLog = (Log *)0x0;
  (this->m_nullLog).super_Log._vptr_Log = (_func_int **)&PTR__Log_001ee7b0;
  this->m_firstPoll = true;
  this->m_stop = true;
  Mutex::Mutex(&this->m_mutex);
  initialize(this);
  return;
}

Assistant:

Initiator::Initiator( Application& application,
                      MessageStoreFactory& messageStoreFactory,
                      const SessionSettings& settings ) EXCEPT ( ConfigError )
: m_threadid( 0 ),
  m_application( application ),
  m_messageStoreFactory( messageStoreFactory ),
  m_settings( settings ),
  m_pLogFactory( 0 ),
  m_pLog( 0 ),
  m_firstPoll( true ),
  m_stop( true )
{ initialize(); }